

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

ostream * smf::MidiFile::writeLittleEndianFloat(ostream *out,float value)

{
  std::operator<<(out,SUB41(value,0));
  std::operator<<(out,(char)((uint)value >> 8));
  std::operator<<(out,(char)((uint)value >> 0x10));
  std::operator<<(out,(char)((uint)value >> 0x18));
  return out;
}

Assistant:

std::ostream& MidiFile::writeLittleEndianFloat(std::ostream& out, float value) {
	union { char bytes[4]; float f; } data;
	data.f = value;
	out << data.bytes[0];
	out << data.bytes[1];
	out << data.bytes[2];
	out << data.bytes[3];
	return out;
}